

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O1

void __thiscall cmFileAPI::ReadClient(cmFileAPI *this,string *client)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  mapped_type *objects;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string *query;
  string *query_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  queries;
  string clientDir;
  undefined1 local_80 [32];
  cmFileAPI *local_60;
  string local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  pcVar1 = (this->APIv1)._M_dataplus._M_p;
  local_80._0_8_ = (string *)(local_80 + 0x10);
  local_60 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + (this->APIv1)._M_string_length);
  std::__cxx11::string::append((char *)local_80);
  plVar4 = (long *)std::__cxx11::string::_M_append(local_80,(ulong)(client->_M_dataplus)._M_p);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar5) {
    local_58.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_58.field_2._8_8_ = plVar4[3];
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_58._M_string_length = plVar4[1];
  *plVar4 = (long)paVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((string *)local_80._0_8_ != (string *)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_80._16_8_)->_M_p + 1));
  }
  LoadDir((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_80,&local_58);
  objects = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFileAPI::ClientQuery>_>_>
            ::operator[](&local_60->ClientQueries,client);
  if (local_80._0_8_ != local_80._8_8_) {
    local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &(objects->DirQuery).Unknown;
    query_00 = (string *)local_80._0_8_;
    do {
      iVar3 = std::__cxx11::string::compare((char *)query_00);
      if (iVar3 == 0) {
        objects->HaveQueryJson = true;
        ReadClientQuery(local_60,client,&objects->QueryJson);
      }
      else {
        bVar2 = ReadQuery(query_00,(vector<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_> *)
                                   objects);
        if (!bVar2) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_38,query_00);
        }
      }
      query_00 = query_00 + 1;
    } while (query_00 != (string *)local_80._8_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFileAPI::ReadClient(std::string const& client)
{
  // Load queries for the client.
  std::string clientDir = this->APIv1 + "/query/" + client;
  std::vector<std::string> queries = this->LoadDir(clientDir);

  // Read the queries and save for later.
  ClientQuery& clientQuery = this->ClientQueries[client];
  for (std::string& query : queries) {
    if (query == "query.json") {
      clientQuery.HaveQueryJson = true;
      this->ReadClientQuery(client, clientQuery.QueryJson);
    } else if (!this->ReadQuery(query, clientQuery.DirQuery.Known)) {
      clientQuery.DirQuery.Unknown.push_back(std::move(query));
    }
  }
}